

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

bool wabt::anon_unknown_0::CWriter::AreInitializersAlwaysNull(Type type)

{
  Enum EVar1;
  Type local_14;
  Type type_local;
  
  local_14 = type;
  EVar1 = Type::operator_cast_to_Enum(&local_14);
  if (EVar1 == ExnRef) {
    type_local.enum_._3_1_ = 1;
  }
  else if (EVar1 == ExternRef) {
    type_local.enum_._3_1_ = 1;
  }
  else {
    if (EVar1 != FuncRef) {
      abort();
    }
    type_local.enum_._3_1_ = Any >> 0x18;
  }
  return (bool)type_local.enum_._3_1_;
}

Assistant:

constexpr bool CWriter::AreInitializersAlwaysNull(Type type) {
  // clang-format off
  switch (type) {
    case Type::FuncRef: return false;
    case Type::ExternRef: return true;
    case Type::ExnRef: return true;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}